

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_update(monster_race *race,monster_lore_conflict *lore)

{
  monster_blow *pmVar1;
  monster_blow *pmVar2;
  monster_blow *pmVar3;
  monster_blow *pmVar4;
  int iVar5;
  bitflag local_27 [8];
  bitflag mask [11];
  wchar_t i;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  
  if ((race != (monster_race *)0x0) && (lore != (monster_lore_conflict *)0x0)) {
    unique0x100003c0 = lore;
    create_mon_flag_mask(local_27,1,0xf);
    flag_union(stack0xffffffffffffffe8->flags,local_27,0xb);
    mask[3] = '\0';
    mask[4] = '\0';
    mask[5] = '\0';
    mask[6] = '\0';
    while (((int)mask._3_4_ < (int)(uint)z_info->mon_blows_max &&
           (race->blow != (monster_blow *)0x0))) {
      if (((stack0xffffffffffffffe8->blow_known[(int)mask._3_4_] & 1U) != 0) ||
         ((stack0xffffffffffffffe8->blows[(int)mask._3_4_].times_seen != 0 ||
          ((stack0xffffffffffffffe8->all_known & 1U) != 0)))) {
        stack0xffffffffffffffe8->blow_known[(int)mask._3_4_] = true;
        stack0xffffffffffffffe8->blows[(int)mask._3_4_].method = race->blow[(int)mask._3_4_].method;
        stack0xffffffffffffffe8->blows[(int)mask._3_4_].effect = race->blow[(int)mask._3_4_].effect;
        pmVar1 = stack0xffffffffffffffe8->blows;
        pmVar2 = race->blow;
        pmVar3 = pmVar2 + (int)mask._3_4_;
        iVar5 = (pmVar3->dice).dice;
        pmVar4 = pmVar1 + (int)mask._3_4_;
        (pmVar4->dice).base = (pmVar3->dice).base;
        (pmVar4->dice).dice = iVar5;
        pmVar2 = pmVar2 + (int)mask._3_4_;
        iVar5 = (pmVar2->dice).m_bonus;
        pmVar1 = pmVar1 + (int)mask._3_4_;
        (pmVar1->dice).sides = (pmVar2->dice).sides;
        (pmVar1->dice).m_bonus = iVar5;
      }
      mask._3_4_ = mask._3_4_ + 1;
    }
    if ((stack0xffffffffffffffe8->tkills != 0) || ((stack0xffffffffffffffe8->all_known & 1U) != 0))
    {
      stack0xffffffffffffffe8->armour_known = true;
      stack0xffffffffffffffe8->drop_known = true;
      create_mon_flag_mask(local_27,10,9,6,0xf);
      flag_union(stack0xffffffffffffffe8->flags,local_27,0xb);
      flag_on_dbg(stack0xffffffffffffffe8->flags,0xb,0xc,"lore->flags","RF_FORCE_DEPTH");
    }
    if ((((race->sleep <
           (int)((uint)stack0xffffffffffffffe8->wake * (uint)stack0xffffffffffffffe8->wake)) ||
         (stack0xffffffffffffffe8->ignore == 0xff)) ||
        ((stack0xffffffffffffffe8->all_known & 1U) != 0)) ||
       ((race->sleep == L'\0' && (9 < stack0xffffffffffffffe8->tkills)))) {
      stack0xffffffffffffffe8->sleep_known = true;
    }
    if ((0x32 < stack0xffffffffffffffe8->cast_innate) ||
       ((stack0xffffffffffffffe8->all_known & 1U) != 0)) {
      stack0xffffffffffffffe8->innate_freq_known = true;
    }
    if ((0x32 < stack0xffffffffffffffe8->cast_spell) ||
       ((stack0xffffffffffffffe8->all_known & 1U) != 0)) {
      stack0xffffffffffffffe8->spell_freq_known = true;
    }
    if ((stack0xffffffffffffffe8->all_known & 1U) != 0) {
      flag_setall(stack0xffffffffffffffe8->flags,0xb);
      flag_copy(stack0xffffffffffffffe8->spell_flags,race->spell_flags,0xc);
    }
  }
  return;
}

Assistant:

void lore_update(const struct monster_race *race, struct monster_lore *lore)
{
	int i;
	bitflag mask[RF_SIZE];

	if (!race || !lore) return;

	/* Assume some "obvious" flags */
	create_mon_flag_mask(mask, RFT_OBV, RFT_MAX);
	rf_union(lore->flags, mask);

	/* Blows */
	for (i = 0; i < z_info->mon_blows_max; i++) {
		if (!race->blow) break;
		if (lore->blow_known[i] || lore->blows[i].times_seen ||
			lore->all_known) {
			lore->blow_known[i] = true;
			lore->blows[i].method = race->blow[i].method;
			lore->blows[i].effect = race->blow[i].effect;
			lore->blows[i].dice = race->blow[i].dice;
		}
	}

	/* Killing a monster reveals some properties */
	if ((lore->tkills > 0) || lore->all_known) {
		lore->armour_known = true;
		lore->drop_known = true;
		create_mon_flag_mask(mask, RFT_RACE_A, RFT_RACE_N, RFT_DROP, RFT_MAX);
		rf_union(lore->flags, mask);
		rf_on(lore->flags, RF_FORCE_DEPTH);
	}

	/* Awareness */
	if ((((int)lore->wake * (int)lore->wake) > race->sleep) ||
	    (lore->ignore == UCHAR_MAX) || lore->all_known ||
	    ((race->sleep == 0) && (lore->tkills >= 10)))
		lore->sleep_known = true;

	/* Spellcasting frequency */
	if (lore->cast_innate > 50 || lore->all_known) {
		lore->innate_freq_known = true;
	}
	if (lore->cast_spell > 50 || lore->all_known) {
		lore->spell_freq_known = true;
	}

	/* Flags for probing and cheating */
	if (lore->all_known) {
		rf_setall(lore->flags);
		rsf_copy(lore->spell_flags, race->spell_flags);
	}
}